

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::iterate(Texture3DFilteringCase *this)

{
  ostringstream *poVar1;
  float fVar2;
  int iVar3;
  undefined8 uVar4;
  TestLog *log;
  RenderContext *context;
  pointer pFVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  uint uVar14;
  undefined4 extraout_var;
  RenderTarget *pRVar16;
  NotSupportedError *this_00;
  byte bVar17;
  char *description;
  TestContext *pTVar18;
  long lVar19;
  pointer pFVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  qpTestResult testResult;
  RandomViewport viewport;
  LodPrecision lodPrecision;
  undefined1 local_3c8 [8];
  float local_3c0;
  float local_3bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  float local_3a8;
  undefined8 local_3a4;
  float local_39c;
  Texture3DView local_390;
  ScopedLogSection section;
  undefined1 local_378 [32];
  size_type sStack_358;
  BVec4 local_350;
  Surface rendered;
  TextureFormat texFmt;
  PixelFormat pixelFormat;
  IVec4 colorBits;
  float local_298;
  float fStack_294;
  undefined1 local_288 [76];
  size_type sStack_23c;
  size_type local_234;
  bool bStack_22c;
  undefined3 uStack_22b;
  CompareMode CStack_228;
  int local_224;
  anon_union_16_3_1194ccdc_for_v local_220;
  undefined8 local_210;
  LodMode local_208;
  undefined1 local_1f0 [32];
  int local_1d0;
  anon_union_16_3_1194ccdc_for_v local_1cc [21];
  TextureFormatInfo fmtInfo;
  long lVar15;
  
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar11);
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar12 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  dVar13 = deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar16,0x40,0x40,dVar12 ^ dVar13);
  iVar11 = this->m_caseNdx;
  pFVar20 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  texFmt = ((pFVar20[iVar11].texture)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_288,"Test",(allocator<char> *)&colorBits);
  de::toString<int>((string *)local_3c8,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rendered,"Test ",(allocator<char> *)&local_390);
  de::toString<int>((string *)&pixelFormat,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rendered,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixelFormat);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1f0,(string *)local_378);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)&pixelFormat);
  std::__cxx11::string::~string((string *)&rendered);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)local_288);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_288,TEXTURETYPE_3D);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  pFVar20 = pFVar20 + iVar11;
  lVar19 = 0;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(local_3c8 + lVar19));
    lVar19 = lVar19 + 0xc;
  } while (lVar19 != 0x30);
  if ((viewport.width < 0x40) || (viewport.height < 0x40)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
               ,0x437);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1f0,this->m_wrapS,this->m_wrapT,this->m_wrapR,this->m_minFilter
                    ,this->m_magFilter);
  local_224 = local_1d0;
  local_234 = local_1f0._16_8_;
  bStack_22c = (bool)local_1f0[0x18];
  uStack_22b = local_1f0._25_3_;
  CStack_228 = local_1f0._28_4_;
  local_288._68_8_ = local_1f0._0_8_;
  sStack_23c = local_1f0._8_8_;
  local_220._0_8_ = local_1cc[0]._0_8_;
  local_220._8_8_ = local_1cc[0]._8_8_;
  local_210 = local_1cc[1]._0_8_;
  local_288._4_4_ = glu::TextureTestUtil::getSamplerType(texFmt);
  local_208 = LODMODE_EXACT;
  local_288._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_288._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_288._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_288._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_288._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_288._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_288._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_288._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1f0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Approximate lod per axis = ");
  tcu::operator<<((ostream *)poVar1,&pFVar20->lod);
  std::operator<<((ostream *)poVar1,", offset = ");
  tcu::operator<<((ostream *)poVar1,&pFVar20->offset);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  fVar22 = (pFVar20->lod).m_data[1];
  fVar23 = (pFVar20->lod).m_data[2];
  fVar2 = (pFVar20->offset).m_data[2];
  uVar4 = *(undefined8 *)(pFVar20->offset).m_data;
  fVar21 = deFloatExp2((pFVar20->lod).m_data[0]);
  iVar8 = viewport.height;
  iVar7 = viewport.width;
  iVar11 = (this->m_gradientTex->m_refTexture).m_width;
  fVar22 = deFloatExp2(fVar22);
  iVar9 = viewport.height;
  iVar3 = (this->m_gradientTex->m_refTexture).m_height;
  fVar23 = deFloatExp2(fVar23);
  iVar6 = viewport.height;
  if (viewport.height < viewport.width) {
    iVar6 = viewport.width;
  }
  auVar25._0_4_ = fVar21 * (float)iVar7;
  auVar25._4_4_ = fVar22 * (float)iVar9;
  auVar25._8_4_ = extraout_XMM0_Db * (float)iVar7;
  auVar25._12_4_ = extraout_XMM0_Db_00 * (float)iVar8;
  auVar26._4_4_ = (float)iVar3;
  auVar26._0_4_ = (float)iVar11;
  auVar26._8_8_ = 0;
  auVar26 = divps(auVar25,auVar26);
  local_39c = ((float)iVar6 * fVar23) / (float)(this->m_gradientTex->m_refTexture).m_depth;
  local_298 = (float)uVar4;
  fStack_294 = (float)((ulong)uVar4 >> 0x20);
  local_3c8._0_4_ = local_298;
  local_3c8._4_4_ = fStack_294;
  local_3b8._M_allocated_capacity._4_4_ = local_39c * 0.5 + fVar2;
  local_3bc = local_298;
  local_3b8._8_4_ = auVar26._0_4_ + local_298;
  local_3b8._M_allocated_capacity._0_4_ = auVar26._4_4_ + fStack_294;
  local_3a4 = CONCAT44(local_3b8._M_allocated_capacity._0_4_,local_3b8._8_4_);
  local_3b8._12_4_ = fStack_294;
  local_39c = local_39c + fVar2;
  local_3c0 = fVar2;
  local_3a8 = (float)local_3b8._M_allocated_capacity._4_4_;
  (**(code **)(lVar15 + 0xb8))(0x806f,pFVar20->texture->m_glTexture);
  (**(code **)(lVar15 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar15 + 0x1360))(0x806f,0x2800,this->m_magFilter);
  (**(code **)(lVar15 + 0x1360))(0x806f,0x2802,this->m_wrapS);
  (**(code **)(lVar15 + 0x1360))(0x806f,0x2803,this->m_wrapT);
  (**(code **)(lVar15 + 0x1360))(0x806f,0x8072,this->m_wrapR);
  (**(code **)(lVar15 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,(float *)local_3c8,(RenderParams *)local_288);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f0);
  dVar12 = this->m_minFilter;
  dVar13 = this->m_magFilter;
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_378._0_8_ = *(undefined8 *)&pRVar16->m_pixelFormat;
  pixelFormat.blueBits = (pRVar16->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar16->m_pixelFormat).alphaBits;
  local_378._8_4_ = pixelFormat.blueBits;
  local_378._12_4_ = pixelFormat.alphaBits;
  pixelFormat._0_8_ = local_378._0_8_;
  tcu::operator-((tcu *)local_1f0,(Vector<int,_4> *)local_378,
                 (dVar13 != 0x2600 || dVar12 != 0x2600) + 1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_390,0);
  tcu::max<int,4>((tcu *)&colorBits,(Vector<int,_4> *)local_1f0,(Vector<int,_4> *)&local_390);
  lodPrecision.rule = RULE_OPENGL;
  lodPrecision.derivateBits = 0x16;
  lodPrecision.lodBits = 0x10;
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_378);
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 6;
  tcu::computeFixedPointThreshold((tcu *)&local_390,&colorBits);
  tcu::operator/((tcu *)local_1f0,(Vector<float,_4> *)&local_390,
                 (Vector<float,_4> *)(local_288 + 0x24));
  local_378._24_8_ = local_1f0._0_8_;
  sStack_358 = local_1f0._8_8_;
  local_378._0_8_ = (pointer)0x1400000014;
  local_378._8_4_ = 0x14;
  local_378._12_4_ = 7;
  local_378._16_4_ = 7;
  local_378._20_4_ = 7;
  auVar24._0_4_ = -(uint)(0 < pixelFormat.redBits);
  auVar24._4_4_ = -(uint)(0 < pixelFormat.greenBits);
  auVar24._8_4_ = -(uint)(0 < pixelFormat.blueBits);
  auVar24._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
  uVar14 = movmskps(7,auVar24);
  bVar17 = (byte)uVar14;
  local_350.m_data =
       (bool  [4])
       (uVar14 & 1 | (uint)((bVar17 & 2) >> 1) << 8 | (uint)((bVar17 & 4) >> 2) << 0x10 |
       (uint)(bVar17 >> 3) << 0x18);
  pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
  local_390.m_numLevels = (pFVar20->texture->m_refTexture).m_view.m_numLevels;
  local_390.m_levels = (pFVar20->texture->m_refTexture).m_view.m_levels;
  bVar10 = glu::TextureTestUtil::verifyTextureResult
                     (pTVar18,(ConstPixelBufferAccess *)local_1f0,&local_390,(float *)local_3c8,
                      (ReferenceParams *)local_288,(LookupPrecision *)local_378,&lodPrecision,
                      &pixelFormat);
  if (!bVar10) {
    lodPrecision.lodBits = 4;
    local_378._12_4_ = 4;
    local_378._16_4_ = 4;
    local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f0 + 8);
    local_378._20_4_ = lodPrecision.lodBits;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Warning: Verification against high precision requirements failed, trying with lower requirements."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
    local_390.m_numLevels = (pFVar20->texture->m_refTexture).m_view.m_numLevels;
    local_390.m_levels = (pFVar20->texture->m_refTexture).m_view.m_levels;
    bVar10 = glu::TextureTestUtil::verifyTextureResult
                       (pTVar18,(ConstPixelBufferAccess *)local_1f0,&local_390,(float *)local_3c8,
                        (ReferenceParams *)local_288,(LookupPrecision *)local_378,&lodPrecision,
                        &pixelFormat);
    if (bVar10) {
      pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar18->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0056bc41;
      description = "Low-quality filtering result";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    else {
      local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1f0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "ERROR: Verification against low precision requirements failed, failing test case."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(pTVar18,testResult,description);
  }
LAB_0056bc41:
  iVar11 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar11;
  pFVar20 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pFVar5 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  tcu::Surface::~Surface(&rendered);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return (IterateResult)(iVar11 < (int)((ulong)((long)pFVar20 - (long)pFVar5) >> 5));
}

Assistant:

Texture3DFilteringCase::IterateResult Texture3DFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport	(m_context.getRenderTarget(), TEX3D_VIEWPORT_WIDTH, TEX3D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt		= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_3D);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	tcu::Vec3						texCoord[4];

	if (viewport.width < TEX3D_MIN_VIEWPORT_WIDTH || viewport.height < TEX3D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapR, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	lodZ	= curCase.lod.z();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float oZ		= curCase.offset.z();
		const float	sX		= deFloatExp2(lodX)*float(viewport.width)							/ float(m_gradientTex->getRefTexture().getWidth());
		const float	sY		= deFloatExp2(lodY)*float(viewport.height)							/ float(m_gradientTex->getRefTexture().getHeight());
		const float	sZ		= deFloatExp2(lodZ)*float(de::max(viewport.width, viewport.height))	/ float(m_gradientTex->getRefTexture().getDepth());

		texCoord[0] = tcu::Vec3(oX,		oY,		oZ);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	oZ + sZ*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		oZ + sZ*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	oZ + sZ);
	}

	gl.bindTexture	(GL_TEXTURE_3D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		m_wrapR);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, (const float*)&texCoord[0], refParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,7);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													   (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,4);

			m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
												  (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}